

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_glows.cxx
# Opt level: O3

void __thiscall xray_re::xr_glow_object::save_v12(xr_glow_object *this,xr_ini_writer *w)

{
  pointer pcVar1;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  xr_ini_writer::write(w,0x1f4f3d,(void *)0x12,in_RCX);
  xr_ini_writer::write(w,0x1f3bd9,__buf,in_RCX);
  pcVar1 = (this->m_shader)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->m_shader)._M_string_length);
  xr_ini_writer::write(w,0x1f28e8,(string *)local_40,0);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pcVar1 = (this->m_texture)._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + (this->m_texture)._M_string_length);
  __n = 0;
  xr_ini_writer::write(w,0x1f28f4,(string *)local_60,0);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  xr_ini_writer::write(w,0x1e76ca,(void *)(ulong)this->m_flags,__n);
  return;
}

Assistant:

void xr_glow_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("version", GLOW_VERSION);
	w->write("radius", m_radius);
	w->write("shader_name", m_shader, false);
	w->write("texture_name", m_texture, false);

	w->write("flags", m_flags);
}